

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_command_runner.cc
# Opt level: O3

bool __thiscall PosixCommandRunner::Finished(PosixCommandRunner *this)

{
  __pid_t _Var1;
  ulong in_RAX;
  bool bVar2;
  int stat;
  undefined8 uStack_18;
  
  bVar2 = true;
  if (-1 < this->current_process_) {
    uStack_18 = in_RAX;
    _Var1 = waitpid(this->current_process_,(int *)((long)&uStack_18 + 4),1);
    if ((_Var1 != 0) && (_Var1 != this->current_process_)) {
      __assert_fail("(res == 0 || res == current_process_) && \"Unexpected return value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/posix_command_runner.cc"
                    ,0x1e,"virtual bool PosixCommandRunner::Finished()");
    }
    if (_Var1 == 0) {
      bVar2 = false;
    }
    else {
      this->current_process_ = -1;
      this->previous_command_failed_ = (uStack_18 & 0xff7f00000000) != 0;
    }
  }
  return bVar2;
}

Assistant:

bool PosixCommandRunner::Finished() {
  if (current_process_ >= 0) {
    // Command may still be running. Ask the kernel for the exit status.
    int stat;
    pid_t res = waitpid(current_process_, &stat, WNOHANG);
    assert((res == 0 || res == current_process_) && "Unexpected return value");
    if (res == 0)
      return false;

    // Command has just terminated. Store whether it has failed.
    current_process_ = -1;
    previous_command_failed_ = !WIFEXITED(stat) || WEXITSTATUS(stat) != 0;
  }
  return true;
}